

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testrecurse.c
# Opt level: O2

int hugeDtdTest(char *filename,char *result,char *err,int options)

{
  bool bVar1;
  xmlHugeDocParts *pxVar2;
  int iVar3;
  long *plVar4;
  long lVar5;
  size_t sVar6;
  size_t sVar7;
  size_t sVar8;
  ulong uVar9;
  uint uVar10;
  
  nb_tests = nb_tests + 1;
  plVar4 = (long *)xmlNewParserCtxt();
  if ((options & 1U) != 0) {
    lVar5 = *plVar4;
    *(undefined8 *)(lVar5 + 200) = 0;
    *(undefined8 *)(lVar5 + 0x70) = 0;
    *(undefined8 *)(lVar5 + 0x78) = 0;
    *(undefined8 *)(lVar5 + 0x88) = 0;
    *(undefined8 *)(lVar5 + 0x90) = 0;
    *(undefined8 *)(lVar5 + 0x98) = 0;
    *(undefined8 *)(lVar5 + 0xa0) = 0;
    *(undefined8 *)(lVar5 + 0xe8) = 0;
    *(undefined8 *)(lVar5 + 0xf0) = 0;
  }
  lVar5 = xmlCtxtReadFile(plVar4,"test/recurse/huge_dtd.xml",0,options & 2U ^ 0x12);
  if (lVar5 == 0) {
    fwrite("Failed to parse huge_dtd.xml\n",0x1d,1,_stderr);
  }
  else {
    iVar3 = xmlStrlen("<!-- comment -->");
    uVar9 = plVar4[0x5d];
    bVar1 = uVar9 < 1000000;
    if (bVar1) {
      fprintf(_stderr,"Total entity size too small: %lu\n");
      uVar9 = plVar4[0x5d];
    }
    uVar10 = (uint)bVar1;
    if (uVar9 != (long)iVar3 * 0x6d4a + 0x9450bU) {
      uVar10 = 1;
      fprintf(_stderr,"Wrong total entity size: %lu (expected %lu)\n");
    }
    pxVar2 = hugeDocParts;
    sVar6 = strlen(hugeDocParts->start);
    sVar7 = strlen(pxVar2->segment);
    sVar8 = strlen(pxVar2->finish);
    if (plVar4[0x58] == sVar8 + sVar7 * 999 + sVar6 + 0x38) goto LAB_00102e00;
    fprintf(_stderr,"Wrong parsed entity size: %lu (expected %lu)\n");
  }
  uVar10 = 1;
LAB_00102e00:
  xmlFreeDoc(lVar5);
  xmlFreeParserCtxt(plVar4);
  return uVar10;
}

Assistant:

static int
hugeDtdTest(const char *filename ATTRIBUTE_UNUSED,
            const char *result ATTRIBUTE_UNUSED,
            const char *err ATTRIBUTE_UNUSED,
            int options) {
    xmlParserCtxtPtr ctxt;
    xmlDocPtr doc;
    int res = 0;
    int parserOptions = XML_PARSE_DTDVALID;

    nb_tests++;

    ctxt = xmlNewParserCtxt();
    if (options & OPT_SAX)
        initSAX(ctxt);
    if ((options & OPT_NO_SUBST) == 0)
        parserOptions |= XML_PARSE_NOENT;
    doc = xmlCtxtReadFile(ctxt, "test/recurse/huge_dtd.xml", NULL,
                          parserOptions);
    if (doc == NULL) {
        fprintf(stderr, "Failed to parse huge_dtd.xml\n");
	res = 1;
    } else {
        unsigned long fixed_cost = 20;
        unsigned long allowed_expansion = 1000000;
        unsigned long a_size = xmlStrlen(BAD_CAST "<!-- comment -->");
        unsigned long b_size;
        unsigned long c_size;
        unsigned long e_size;
        unsigned long f_size;
        unsigned long total_size;

        if (ctxt->sizeentcopy < allowed_expansion) {
            fprintf(stderr, "Total entity size too small: %lu\n",
                    ctxt->sizeentcopy);
            res = 1;
        }

        b_size = (a_size + strlen("&a;") + fixed_cost) * 2;
        c_size = (b_size + strlen("&b;") + fixed_cost) * 2;
        /*
         * Internal parameter entites are substitued eagerly and
         * need different accounting.
         */
        e_size = a_size * 2;
        f_size = e_size * 2;
        total_size = /* internal */
                     e_size + f_size + fixed_cost * 4 +
                     (a_size + e_size + f_size + fixed_cost * 3) *
                     (MAX_NODES - 1) * 2 +
                     /* external */
                     (a_size + b_size + c_size + fixed_cost * 3) *
                     (MAX_NODES - 1) * 2 +
                     /* final reference in main doc */
                     strlen("success") + fixed_cost;
        if (ctxt->sizeentcopy != total_size) {
            fprintf(stderr, "Wrong total entity size: %lu (expected %lu)\n",
                    ctxt->sizeentcopy, total_size);
            res = 1;
        }

        total_size = strlen(hugeDocParts->start) +
                     strlen(hugeDocParts->segment) * (MAX_NODES - 1) +
                     strlen(hugeDocParts->finish) +
                     /*
                      * Other external entities pa.ent, pb.ent, pc.ent.
                      * These are currently counted twice because they're
                      * used both in DTD and EntityValue.
                      */
                     (16 + 6 + 6) * 2;
        if (ctxt->sizeentities != total_size) {
            fprintf(stderr, "Wrong parsed entity size: %lu (expected %lu)\n",
                    ctxt->sizeentities, total_size);
            res = 1;
        }
    }

    xmlFreeDoc(doc);
    xmlFreeParserCtxt(ctxt);

    return(res);
}